

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O2

bool __thiscall QVLABase<QLocaleId>::contains<QLocaleId>(QVLABase<QLocaleId> *this,QLocaleId *t)

{
  void *pvVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  
  pvVar1 = (this->super_QVLABaseBase).ptr;
  lVar2 = (this->super_QVLABaseBase).s * 6;
  do {
    lVar4 = lVar2;
    if (lVar4 == 0) break;
    bVar3 = QLocaleId::operator==((QLocaleId *)((long)pvVar1 + lVar4 + -6),*t);
    lVar2 = lVar4 + -6;
  } while (!bVar3);
  return lVar4 != 0;
}

Assistant:

Q_INLINE_TEMPLATE bool QVLABase<T>::contains(const AT &t) const
{
    const T *b = begin();
    const T *i = end();
    while (i != b) {
        if (*--i == t)
            return true;
    }
    return false;
}